

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_json.c
# Opt level: O1

_Bool JSON_stringify(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_class_t *pgVar1;
  gravity_object_t *pgVar2;
  uint32_t uVar3;
  gravity_string_t *pgVar4;
  json_t *json;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar5;
  char *pcVar6;
  ulong uVar7;
  size_t size;
  gravity_value_t gVar8;
  size_t len;
  char vbuffer [512];
  size_t local_1040;
  char local_1038 [4104];
  
  if (nargs < 2) {
    gVar8.field_1.n = 0;
    gVar8.isa = gravity_class_null;
  }
  else {
    pgVar1 = args[1].isa;
    pgVar2 = args[1].field_1.p;
    gVar8 = args[1];
    if (pgVar1 == gravity_class_string) {
      uVar7 = (ulong)*(uint *)((long)&pgVar2->identifier + 4);
      if (0xffa < uVar7) {
        size = uVar7 + 5;
        pcVar6 = (char *)gravity_calloc((gravity_vm *)0x0,1,size);
        uVar3 = snprintf(pcVar6,size,"\"%s\"");
        pgVar4 = gravity_string_new(vm,pcVar6,uVar3,0);
        pgVar1 = pgVar4->isa;
        aVar5.p = (gravity_object_t *)gravity_string_new(vm,pcVar6,uVar3,0);
        gVar8.field_1.p = (gravity_object_t *)aVar5.n;
        gVar8.isa = pgVar1;
        goto LAB_00140cd0;
      }
      pcVar6 = local_1038;
      uVar3 = snprintf(pcVar6,0x1000,"\"%s\"",pgVar2->objclass);
    }
    else {
      if (pgVar1 == gravity_class_null && pgVar2 < (gravity_object_t *)0x2) {
        pcVar6 = "null";
      }
      else if (pgVar1 == gravity_class_float) {
        pcVar6 = local_1038;
        snprintf(pcVar6,0x200,"%f",pgVar2);
      }
      else if (pgVar1 == gravity_class_bool) {
        pcVar6 = "true";
        if (pgVar2 == (gravity_object_t *)0x0) {
          pcVar6 = "false";
        }
      }
      else if (pgVar1 == gravity_class_int) {
        pcVar6 = local_1038;
        snprintf(pcVar6,0x200,"%ld",pgVar2);
      }
      else {
        pcVar6 = (char *)0x0;
      }
      if (pcVar6 == (char *)0x0) {
        json = json_new();
        json_set_option(json,json_opt_no_maptype);
        json_set_option(json,json_opt_no_undef);
        json_set_option(json,json_opt_prettify);
        gravity_value_serialize((char *)0x0,gVar8,json);
        local_1040 = 0;
        pcVar6 = json_buffer(json,&local_1040);
        pcVar6 = string_ndup(pcVar6,local_1040);
        aVar5.p = (gravity_object_t *)gravity_string_new(vm,pcVar6,(uint32_t)local_1040,0);
        json_free(json);
        gVar8.field_1.p = (gravity_object_t *)aVar5.n;
        gVar8.isa = (aVar5.p)->isa;
        goto LAB_00140cd0;
      }
      uVar3 = 0xffffffff;
    }
    gVar8 = gravity_string_to_value(vm,pcVar6,uVar3);
  }
LAB_00140cd0:
  gravity_vm_setslot(vm,gVar8,rindex);
  return true;
}

Assistant:

static bool JSON_stringify (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_VALUE(VALUE_FROM_NULL, rindex);
    
    // extract value
    gravity_value_t value = GET_VALUE(1);
    
    // special case for string because it can be huge (and must be quoted)
    if (VALUE_ISA_STRING(value)) {
        const int nchars = 5;
        const char *v = VALUE_AS_STRING(value)->s;
        size_t vlen = VALUE_AS_STRING(value)->len;

        // string must be quoted
        if (vlen < 4096-nchars) {
            char vbuffer2[4096];
            vlen = snprintf(vbuffer2, sizeof(vbuffer2), "\"%s\"", v);
            RETURN_VALUE(VALUE_FROM_STRING(vm, vbuffer2, (uint32_t)vlen), rindex);
        } else {
            char *vbuffer2 = mem_alloc(NULL, vlen + nchars);
            vlen = snprintf(vbuffer2, vlen + nchars, "\"%s\"", v);
            RETURN_VALUE(VALUE_FROM_OBJECT(gravity_string_new(vm, vbuffer2, (uint32_t)vlen, 0)), rindex);
        }
    }
    
    // primitive cases supported by JSON (true, false, null, number)
    char vbuffer[512];
    const char *v = NULL;
    
    if (VALUE_ISA_NULL(value) || (VALUE_ISA_UNDEFINED(value))) v = "null";
    // was %g but we don't like scientific notation nor the missing .0 in case of float number with no decimals
    else if (VALUE_ISA_FLOAT(value)) {snprintf(vbuffer, sizeof(vbuffer), "%f", value.f); v = vbuffer;}
    else if (VALUE_ISA_BOOL(value)) v = (value.n) ? "true" : "false";
    else if (VALUE_ISA_INT(value)) {
        #if GRAVITY_ENABLE_INT64
        snprintf(vbuffer, sizeof(vbuffer), "%" PRId64 "", value.n);
        #else
        snprintf(vbuffer, sizeof(vbuffer), "%d", value.n);
        #endif
        v = vbuffer;
    }
    if (v) RETURN_VALUE(VALUE_FROM_CSTRING(vm, v), rindex);
    
    // more complex object case (list, map, class, closure, instance/object)
    json_t *json = json_new();
    json_set_option(json, json_opt_no_maptype);
    json_set_option(json, json_opt_no_undef);
    json_set_option(json, json_opt_prettify);
    gravity_value_serialize(NULL, value, json);
    
    size_t len = 0;
    const char *jbuffer = json_buffer(json, &len);
    const char *buffer = string_ndup(jbuffer, len);
    
    gravity_string_t *s = gravity_string_new(vm, (char *)buffer, (uint32_t)len, 0);
    json_free(json);
    
    RETURN_VALUE(VALUE_FROM_OBJECT(s), rindex);
}